

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TgSymGroupPerm(Abc_TgMan_t *pMan,int idx,int fSwapOnly)

{
  word *pIn1;
  int iVar1;
  int iVar2;
  int idx_00;
  uint uVar3;
  Abc_TgMan_t *pDst;
  Abc_TgMan_t tgManCopy;
  Abc_TgMan_t tgManBest;
  
  pIn1 = pMan->pTruth;
  iVar1 = 1 << ((char)pMan->nVars - 6U & 0x1f);
  if (pMan->nVars < 7) {
    iVar1 = 1;
  }
  CheckConfig(pMan);
  pDst = &tgManCopy;
  Abc_TgManCopy(pDst,Abc_TgSymGroupPerm::pCopy,pMan);
  if (fSwapOnly == 0) {
    Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,pMan);
    Abc_TgFlipSymGroup(&tgManCopy,idx);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
    }
    uVar3 = (uint)(iVar2 == 1);
    idx_00 = idx + 1;
    Abc_TgFlipSymGroup(&tgManCopy,idx_00);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
      uVar3 = 3;
    }
    Abc_TgFlipSymGroup(&tgManCopy,idx);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
      uVar3 = 2;
    }
    Abc_TgSwapAdjacentSymGroups(&tgManCopy,idx);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
      uVar3 = 6;
    }
    Abc_TgFlipSymGroup(&tgManCopy,idx_00);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
      uVar3 = 7;
    }
    Abc_TgFlipSymGroup(&tgManCopy,idx);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
      uVar3 = 5;
    }
    Abc_TgFlipSymGroup(&tgManCopy,idx_00);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtCompareRev(Abc_TgSymGroupPerm::pBest,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 1) {
      Abc_TgManCopy(&tgManBest,Abc_TgSymGroupPerm::pBest,&tgManCopy);
      uVar3 = 4;
    }
    Abc_TgSwapAdjacentSymGroups(&tgManCopy,idx);
    CheckConfig(&tgManCopy);
    iVar2 = Abc_TtEqual(pIn1,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (iVar2 == 0) {
      __assert_fail("Abc_TtEqual(pTruth, pCopy, nWords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x846,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
    }
    pDst = &tgManBest;
    if (uVar3 == 0) {
      return 0;
    }
    iVar1 = Abc_TtCompareRev(pIn1,Abc_TgSymGroupPerm::pBest,iVar1);
    if (iVar1 != 1) {
      __assert_fail("Abc_TtCompareRev(pTruth, pBest, nWords) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                    ,0x849,"int Abc_TgSymGroupPerm(Abc_TgMan_t *, int, int)");
    }
  }
  else {
    Abc_TgSwapAdjacentSymGroups(pDst,idx);
    CheckConfig(pDst);
    iVar1 = Abc_TtCompareRev(pIn1,Abc_TgSymGroupPerm::pCopy,iVar1);
    if (-1 < iVar1) {
      return 0;
    }
    uVar3 = 4;
  }
  Abc_TgManCopy(pMan,pIn1,pDst);
  return uVar3;
}

Assistant:

static int Abc_TgSymGroupPerm(Abc_TgMan_t* pMan, int idx, int fSwapOnly)
{
    word* pTruth = pMan->pTruth;
    static word pCopy[1024];
    static word pBest[1024];
    int Config = 0;
    int nWords = Abc_TtWordNum(pMan->nVars);
    Abc_TgMan_t tgManCopy, tgManBest;

    CheckConfig(pMan);
    if (fSwapOnly)
    {
        Abc_TgManCopy(&tgManCopy, pCopy, pMan);
        Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
        CheckConfig(&tgManCopy);
        if (Abc_TtCompareRev(pTruth, pCopy, nWords) < 0)
        {
            Abc_TgManCopy(pMan, pTruth, &tgManCopy);
            return 4;
        }
        return 0;
    }

    // save two copies
    Abc_TgManCopy(&tgManCopy, pCopy, pMan);
    Abc_TgManCopy(&tgManBest, pBest, pMan);
    // PXY
    // 001
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 1;
    // PXY
    // 011
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 3;
    // PXY
    // 010
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 2;
    // PXY
    // 110
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 6;
    // PXY
    // 111
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 7;
    // PXY
    // 101
    Abc_TgFlipSymGroup(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 5;
    // PXY
    // 100
    Abc_TgFlipSymGroup(&tgManCopy, idx + 1);
    CheckConfig(&tgManCopy);
    if (Abc_TtCompareRev(pBest, pCopy, nWords) == 1)
        Abc_TgManCopy(&tgManBest, pBest, &tgManCopy), Config = 4;
    // PXY
    // 000
    Abc_TgSwapAdjacentSymGroups(&tgManCopy, idx);
    CheckConfig(&tgManCopy);
    assert(Abc_TtEqual(pTruth, pCopy, nWords));
    if (Config == 0)
        return 0;
    assert(Abc_TtCompareRev(pTruth, pBest, nWords) == 1);
    Abc_TgManCopy(pMan, pTruth, &tgManBest);
    return Config;
}